

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N,char *Name,_Bool *Valid)

{
  _Bool _Var1;
  uint local_2c;
  uint i;
  _Bool *Valid_local;
  char *Name_local;
  A64NamedImmMapper *N_local;
  
  local_2c = 0;
  while( true ) {
    if (N->NumPairs <= (ulong)local_2c) {
      *Valid = false;
      return 0xffffffff;
    }
    _Var1 = compare_lower_str(N->Pairs[local_2c].Name,Name);
    if (_Var1) break;
    local_2c = local_2c + 1;
  }
  *Valid = true;
  return N->Pairs[local_2c].Value;
}

Assistant:

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N, char *Name, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (compare_lower_str(N->Pairs[i].Name, Name)) {
			*Valid = true;
			return N->Pairs[i].Value;
		}
	}

	*Valid = false;
	return (uint32_t)-1;
}